

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

opStatus __thiscall
llvm::detail::DoubleAPFloat::convertFromAPInt
          (DoubleAPFloat *this,APInt *Input,bool IsSigned,roundingMode RM)

{
  APFloat *__ptr;
  opStatus oVar1;
  APFloat Tmp;
  undefined1 auStack_68 [8];
  _Head_base<0UL,_llvm::APFloat_*,_false> local_60;
  anon_union_8_2_1313ab2f_for_U local_58;
  uint local_50;
  APFloat local_48;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    IEEEFloat::IEEEFloat(&local_48.U.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy);
    oVar1 = APFloat::convertFromAPInt(&local_48,Input,IsSigned,RM);
    APFloat::bitcastToAPInt((APFloat *)&local_58);
    DoubleAPFloat((DoubleAPFloat *)auStack_68,(fltSemantics *)semPPCDoubleDouble,(APInt *)&local_58)
    ;
    if ((DoubleAPFloat *)auStack_68 != this) {
      __ptr = (this->Floats)._M_t.
              super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
              super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
              super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
      if (__ptr != (APFloat *)0x0) {
        std::default_delete<llvm::APFloat[]>::operator()
                  ((default_delete<llvm::APFloat[]> *)&this->Floats,__ptr);
      }
      (this->Floats)._M_t.
      super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
      super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
      super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl = (APFloat *)0x0;
      DoubleAPFloat(this,(DoubleAPFloat *)auStack_68);
    }
    if (local_60._M_head_impl != (APFloat *)0x0) {
      std::default_delete<llvm::APFloat[]>::operator()
                ((default_delete<llvm::APFloat[]> *)&local_60,local_60._M_head_impl);
    }
    local_60._M_head_impl = (APFloat *)0x0;
    if ((0x40 < local_50) && ((void *)local_58.VAL != (void *)0x0)) {
      operator_delete__(local_58.pVal);
    }
    APFloat::Storage::~Storage((Storage *)&local_48.U.IEEE);
    return oVar1;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x10d7,
                "APFloat::opStatus llvm::detail::DoubleAPFloat::convertFromAPInt(const APInt &, bool, roundingMode)"
               );
}

Assistant:

APFloat::opStatus DoubleAPFloat::convertFromAPInt(const APInt &Input,
                                                  bool IsSigned,
                                                  roundingMode RM) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy);
  auto Ret = Tmp.convertFromAPInt(Input, IsSigned, RM);
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}